

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBooleanStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TransformFeedbackImplicitResumeTestCase::
testTransformFeedback(TransformFeedbackImplicitResumeTestCase *this)

{
  StateVerifier *pSVar1;
  TransformFeedbackImplicitResumeTestCase *this_local;
  
  glu::CallLogWrapper::glBeginTransformFeedback
            (&(this->super_TransformFeedbackTestCase).super_ApiCase.super_CallLogWrapper,0);
  ApiCase::expectError((ApiCase *)this,0);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e24,1);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e23,0);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glPauseTransformFeedback
            (&(this->super_TransformFeedbackTestCase).super_ApiCase.super_CallLogWrapper);
  ApiCase::expectError((ApiCase *)this,0);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e24,1);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e23,1);
  ApiCase::expectError((ApiCase *)this,0);
  glu::CallLogWrapper::glEndTransformFeedback
            (&(this->super_TransformFeedbackTestCase).super_ApiCase.super_CallLogWrapper);
  ApiCase::expectError((ApiCase *)this,0);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e24,0);
  pSVar1 = (this->super_TransformFeedbackTestCase).m_verifier;
  (*pSVar1->_vptr_StateVerifier[2])
            (pSVar1,(this->super_TransformFeedbackTestCase).super_ApiCase.super_TestCase.
                    super_TestCase.super_TestNode.m_testCtx,0x8e23,0);
  ApiCase::expectError((ApiCase *)this,0);
  return;
}

Assistant:

void testTransformFeedback (void)
	{
		glBeginTransformFeedback(GL_POINTS);
		expectError(GL_NO_ERROR);

		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_ACTIVE, true);
		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_PAUSED, false);
		expectError(GL_NO_ERROR);

		glPauseTransformFeedback();
		expectError(GL_NO_ERROR);

		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_ACTIVE, true);
		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_PAUSED, true);
		expectError(GL_NO_ERROR);

		glEndTransformFeedback();
		expectError(GL_NO_ERROR);

		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_ACTIVE, false);
		m_verifier->verifyBoolean(m_testCtx, GL_TRANSFORM_FEEDBACK_PAUSED, false);
		expectError(GL_NO_ERROR);
	}